

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,string *condition,string *orderBy)

{
  bool bVar1;
  SQLiteSelect sel;
  string order;
  string where;
  string query;
  allocator local_189;
  shared_connection local_188;
  SQLiteSelect local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  if (condition->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   " WHERE ",condition);
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  if (orderBy->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   " ORDER BY ",orderBy);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  std::__cxx11::string::string((string *)&local_c8,"hiberlite_id",&local_189);
  std::operator+(&local_a8,"SELECT ",&local_c8);
  std::operator+(&local_88,&local_a8," FROM ");
  std::operator+(&local_68,&local_88,table);
  std::operator+(&local_148,&local_68,&local_108);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                 &local_148,&local_128);
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,";"
                );
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_188._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_188.res = con->res;
  if (local_188.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_188.res)->refCount = (local_188.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_e8,(string *)&local_48);
  SQLiteSelect::SQLiteSelect(&local_178,&local_188,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_188);
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    bVar1 = SQLiteSelect::step(&local_178);
    if (!bVar1) break;
    local_148._M_dataplus._M_p = (pointer)SQLiteSelect::get_int64(&local_178,0);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              (__return_storage_ptr__,(longlong *)&local_148);
  }
  SQLiteSelect::~SQLiteSelect(&local_178);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectIds(shared_connection con, const std::string table, const std::string condition, const std::string orderBy)
{
	std::string where;
	if(condition.size())
		where=" WHERE "+condition;
	std::string order;
	if(orderBy.size())
		order=" ORDER BY "+orderBy;
	std::string query="SELECT "+std::string(HIBERLITE_PRIMARY_KEY_COLUMN)
			+" FROM "+table
			+where
			+order
			+";";
	SQLiteSelect sel(con, query);
	std::vector<sqlid_t> ans;
	while(sel.step())
		ans.push_back( sel.get_int64(0) );
	return ans;
}